

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

Array<const_char_*const> * __thiscall
kj::heapArray<char_const*const,char_const*const*>
          (Array<const_char_*const> *__return_storage_ptr__,kj *this,char **begin,char **end)

{
  char **__dest;
  Array<const_char_*const> *result;
  ulong __n;
  char **ppcVar1;
  
  __dest = (char **)_::HeapArrayDisposer::allocateImpl
                              (8,0,(long)begin - (long)this >> 3,(_func_void_void_ptr *)0x0,
                               (_func_void_void_ptr *)0x0);
  ppcVar1 = __dest;
  if ((long)begin - (long)this != 0) {
    __n = (long)begin - (long)this & 0xfffffffffffffff8;
    memcpy(__dest,this,__n);
    ppcVar1 = (char **)(__n + (long)__dest);
  }
  __return_storage_ptr__->ptr = __dest;
  __return_storage_ptr__->size_ = (long)ppcVar1 - (long)__dest >> 3;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}